

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

FT_Error T1_Get_Var_Design(T1_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  PS_Blend pPVar1;
  FT_Fixed FVar2;
  FT_Error FVar3;
  PS_DesignMap axismap;
  uint axis_count;
  ulong uVar4;
  FT_Fixed local_58;
  FT_Fixed axiscoords [4];
  
  pPVar1 = face->blend;
  if (pPVar1 == (PS_Blend)0x0) {
    FVar3 = 6;
  }
  else {
    axis_count = pPVar1->num_axis;
    mm_weights_unmap(pPVar1->weight_vector,&local_58,axis_count);
    if (num_coords <= axis_count) {
      axis_count = num_coords;
    }
    uVar4 = 0;
    if (axis_count != 0) {
      axismap = pPVar1->design_map;
      uVar4 = 0;
      do {
        FVar2 = mm_axis_unmap(axismap,axiscoords[uVar4 - 1]);
        coords[uVar4] = FVar2;
        uVar4 = uVar4 + 1;
        axismap = axismap + 1;
      } while (axis_count != uVar4);
    }
    FVar3 = 0;
    if ((uint)uVar4 < num_coords) {
      FVar3 = 0;
      memset(coords + (uVar4 & 0xffffffff),0,(ulong)(~(uint)uVar4 + num_coords) * 8 + 8);
    }
  }
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_Var_Design( T1_Face    face,
                     FT_UInt    num_coords,
                     FT_Fixed*  coords )
  {
    PS_Blend  blend = face->blend;

    FT_Fixed  axiscoords[4];
    FT_UInt   i, nc;


    if ( !blend )
      return FT_THROW( Invalid_Argument );

    mm_weights_unmap( blend->weight_vector,
                      axiscoords,
                      blend->num_axis );

    nc = num_coords;
    if ( num_coords > blend->num_axis )
    {
      FT_TRACE2(( "T1_Get_Var_Design:"
                  " only using first %d of %d coordinates\n",
                  blend->num_axis, num_coords ));
      nc = blend->num_axis;
    }

    for ( i = 0; i < nc; i++ )
      coords[i] = mm_axis_unmap( &blend->design_map[i], axiscoords[i] );
    for ( ; i < num_coords; i++ )
      coords[i] = 0;

    return FT_Err_Ok;
  }